

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_postfix(int allow_member_expr,int allow_call_expr)

{
  tc_toktyp_t tVar1;
  CTcTokenizer *this;
  int in_ESI;
  int in_EDI;
  tc_toktyp_t op;
  CTcPrsNode *sub;
  CTcPrsNode *in_stack_00000058;
  CTcPrsNode *in_stack_000000c8;
  CTcPrsNode *in_stack_fffffffffffffff8;
  
  this = (CTcTokenizer *)parse_primary();
  do {
    if (this == (CTcTokenizer *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x25766d);
    switch(tVar1) {
    case TOKT_LPAR:
      if (in_ESI == 0) {
        return (CTcPrsNode *)this;
      }
      this = (CTcTokenizer *)parse_call(in_stack_000000c8);
      break;
    default:
      return (CTcPrsNode *)this;
    case TOKT_DOT:
      if (in_EDI == 0) {
        return (CTcPrsNode *)this;
      }
      this = (CTcTokenizer *)parse_member(in_stack_00000058);
      break;
    case TOKT_LBRACK:
      this = (CTcTokenizer *)parse_subscript(in_stack_fffffffffffffff8);
      break;
    case TOKT_INC:
      CTcTokenizer::next(this);
      this = (CTcTokenizer *)
             parse_inc((int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                       (CTcPrsNode *)CONCAT44(in_EDI,in_ESI));
      break;
    case TOKT_DEC:
      CTcTokenizer::next(this);
      this = (CTcTokenizer *)
             parse_dec((int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                       (CTcPrsNode *)CONCAT44(in_EDI,in_ESI));
    }
  } while( true );
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_postfix(int allow_member_expr,
                                         int allow_call_expr)
{
    /* parse a primary expression */
    CTcPrsNode *sub = parse_primary();
    if (sub == 0)
        return 0;

    /* keep going as long as we find postfix operators */
    for (;;)
    {
        /* check for a postfix operator */
        tc_toktyp_t op = G_tok->cur();
        switch(op)
        {
        case TOKT_LPAR:
            /* left paren - function or method call */
            if (allow_call_expr)
            {
                /* parse the function call expression */
                sub = parse_call(sub);
            }
            else
            {
                /* call expressions aren't allowed - stop here */
                return sub;
            }
            break;

        case TOKT_LBRACK:
            /* left square bracket - subscript */
            sub = parse_subscript(sub);
            break;

        case TOKT_DOT:
            /* 
             *   Dot - member selection.  If a member expression is allowed
             *   by the caller, parse it; otherwise, just return the
             *   expression up to this point.  
             */
            if (allow_member_expr)
            {
                /* 
                 *   it's allowed - parse it and continue to look for other
                 *   postfix expressions following the member expression 
                 */
                sub = parse_member(sub);
            }
            else
            {
                /* 
                 *   member expressions aren't allowed - stop here,
                 *   returning the expression up to this point 
                 */
                return sub;
            }
            break;

        case TOKT_INC:
            /* post-increment */
            G_tok->next();
            sub = parse_inc(FALSE, sub);
            break;

        case TOKT_DEC:
            /* post-decrement */
            G_tok->next();
            sub = parse_dec(FALSE, sub);
            break;
            
        default:
            /* it's not a postfix operator - return the result */
            return sub;
        }

        /* if the last parse failed, return failure */
        if (sub == 0)
            return 0;
    }
}